

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool __thiscall wasm::WATParser::Lexer::takeLParen(Lexer *this)

{
  size_t sVar1;
  string_view in;
  basic_string_view<char,_std::char_traits<char>_> sv;
  LexCtx local_30;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  in = next(this);
  anon_unknown_0::LexCtx::LexCtx(&local_30,in);
  sv = ::sv("(",1);
  sVar1 = anon_unknown_0::LexCtx::startsWith(&local_30,sv);
  if (sVar1 != 0) {
    this->pos = this->pos + 1;
    advance(this);
  }
  return sVar1 != 0;
}

Assistant:

bool Lexer::takeLParen() {
  if (LexCtx(next()).startsWith("("sv)) {
    ++pos;
    advance();
    return true;
  }
  return false;
}